

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Vec_Bit_t * Acec_MapMajOuts(Gia_Man_t *p,Vec_Int_t *vAdds)

{
  uint uVar1;
  Vec_Bit_t *pVVar2;
  int *__s;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  pVVar2->nSize = 0;
  iVar5 = iVar6 * 0x20;
  pVVar2->nCap = iVar5;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 * 4);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar5;
  memset(__s,0,(long)iVar6 << 2);
  iVar6 = vAdds->nSize;
  if (0 < iVar6) {
    uVar3 = 4;
    do {
      if (iVar6 <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vAdds->pArray[uVar3];
      if (((int)uVar1 < 0) || (iVar5 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      iVar4 = uVar3 + 2;
      uVar3 = uVar3 + 6;
    } while (iVar4 < iVar6);
  }
  return pVVar2;
}

Assistant:

Vec_Bit_t * Acec_MapMajOuts( Gia_Man_t * p, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vAdds, 6*i+4), 1 );
    return vMap;
}